

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

void mask_write_buffer(cio_write_buffer *write_buffer,uint8_t *mask,size_t mask_length)

{
  size_t sVar1;
  size_t middle;
  size_t i;
  size_t num_buffers;
  size_t mask_length_local;
  uint8_t *mask_local;
  cio_write_buffer *write_buffer_local;
  
  sVar1 = cio_write_buffer_get_num_buffer_elements(write_buffer);
  mask_local = (uint8_t *)write_buffer;
  for (middle = 0; middle < sVar1; middle = middle + 1) {
    mask_local = *(uint8_t **)mask_local;
    cio_websocket_mask(*(uint8_t **)(mask_local + 0x10),*(size_t *)(mask_local + 0x18),mask);
    rotate(mask,(uint_fast8_t)(*(ulong *)(mask_local + 0x18) % mask_length));
  }
  return;
}

Assistant:

static void mask_write_buffer(const struct cio_write_buffer *write_buffer, uint8_t *mask, size_t mask_length)
{
	size_t num_buffers = cio_write_buffer_get_num_buffer_elements(write_buffer);
	for (size_t i = 0; i < num_buffers; i++) {
		write_buffer = write_buffer->next;
		cio_websocket_mask(write_buffer->data.element.data, write_buffer->data.element.length, mask);
		size_t middle = write_buffer->data.element.length % mask_length;
		rotate(mask, (uint_fast8_t)middle);
	}
}